

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pa_front.c
# Opt level: O3

PaError Pa_OpenDefaultStream
                  (PaStream **stream,int inputChannelCount,int outputChannelCount,
                  PaSampleFormat sampleFormat,double sampleRate,unsigned_long framesPerBuffer,
                  PaStreamCallback *streamCallback,void *userData)

{
  PaError PVar1;
  PaDeviceInfo *pPVar2;
  PaStreamParameters *outputParameters;
  PaStreamParameters *inputParameters;
  PaStreamParameters hostApiOutputParameters;
  PaStreamParameters hostApiInputParameters;
  PaStreamParameters local_70;
  PaStreamParameters local_50;
  
  if (inputChannelCount < 1) {
    inputParameters = (PaStreamParameters *)0x0;
  }
  else {
    if (initializationCount_ == 0) {
      return -0x2701;
    }
    if ((long)defaultHostApiIndex_ < 0) {
      return -0x2701;
    }
    if (hostApisCount_ <= defaultHostApiIndex_) {
      return -0x2701;
    }
    local_50.device = (hostApis_[defaultHostApiIndex_]->info).defaultInputDevice;
    if (local_50.device == -1) {
      return -0x2701;
    }
    inputParameters = &local_50;
    local_50.channelCount = inputChannelCount;
    local_50.sampleFormat = sampleFormat;
    pPVar2 = Pa_GetDeviceInfo(local_50.device);
    local_50.suggestedLatency = pPVar2->defaultHighInputLatency;
    local_50.hostApiSpecificStreamInfo = (void *)0x0;
  }
  if (outputChannelCount < 1) {
    outputParameters = (PaStreamParameters *)0x0;
  }
  else {
    if (initializationCount_ == 0) {
      return -0x2701;
    }
    if ((long)defaultHostApiIndex_ < 0) {
      return -0x2701;
    }
    if (hostApisCount_ <= defaultHostApiIndex_) {
      return -0x2701;
    }
    local_70.device = (hostApis_[defaultHostApiIndex_]->info).defaultOutputDevice;
    if (local_70.device == -1) {
      return -0x2701;
    }
    outputParameters = &local_70;
    local_70.channelCount = outputChannelCount;
    local_70.sampleFormat = sampleFormat;
    pPVar2 = Pa_GetDeviceInfo(local_70.device);
    local_70.suggestedLatency = pPVar2->defaultHighOutputLatency;
    local_70.hostApiSpecificStreamInfo = (void *)0x0;
  }
  PVar1 = Pa_OpenStream(stream,inputParameters,outputParameters,sampleRate,framesPerBuffer,0,
                        streamCallback,userData);
  return PVar1;
}

Assistant:

PaError Pa_OpenDefaultStream( PaStream** stream,
                              int inputChannelCount,
                              int outputChannelCount,
                              PaSampleFormat sampleFormat,
                              double sampleRate,
                              unsigned long framesPerBuffer,
                              PaStreamCallback *streamCallback,
                              void *userData )
{
    PaError result;
    PaStreamParameters hostApiInputParameters, hostApiOutputParameters;
    PaStreamParameters *hostApiInputParametersPtr, *hostApiOutputParametersPtr;

    PA_LOGAPI_ENTER_PARAMS( "Pa_OpenDefaultStream" );
    PA_LOGAPI(("\tPaStream** stream: 0x%p\n", stream ));
    PA_LOGAPI(("\tint inputChannelCount: %d\n", inputChannelCount ));
    PA_LOGAPI(("\tint outputChannelCount: %d\n", outputChannelCount ));
    PA_LOGAPI(("\tPaSampleFormat sampleFormat: %d\n", sampleFormat ));
    PA_LOGAPI(("\tdouble sampleRate: %g\n", sampleRate ));
    PA_LOGAPI(("\tunsigned long framesPerBuffer: %d\n", framesPerBuffer ));
    PA_LOGAPI(("\tPaStreamCallback *streamCallback: 0x%p\n", streamCallback ));
    PA_LOGAPI(("\tvoid *userData: 0x%p\n", userData ));


    if( inputChannelCount > 0 )
    {
        hostApiInputParameters.device = Pa_GetDefaultInputDevice();
		if( hostApiInputParameters.device == paNoDevice )
			return paDeviceUnavailable;

        hostApiInputParameters.channelCount = inputChannelCount;
        hostApiInputParameters.sampleFormat = sampleFormat;
        /* defaultHighInputLatency is used below instead of
           defaultLowInputLatency because it is more important for the default
           stream to work reliably than it is for it to work with the lowest
           latency.
         */
        hostApiInputParameters.suggestedLatency =
             Pa_GetDeviceInfo( hostApiInputParameters.device )->defaultHighInputLatency;
        hostApiInputParameters.hostApiSpecificStreamInfo = NULL;
        hostApiInputParametersPtr = &hostApiInputParameters;
    }
    else
    {
        hostApiInputParametersPtr = NULL;
    }

    if( outputChannelCount > 0 )
    {
        hostApiOutputParameters.device = Pa_GetDefaultOutputDevice();
		if( hostApiOutputParameters.device == paNoDevice )
			return paDeviceUnavailable;

        hostApiOutputParameters.channelCount = outputChannelCount;
        hostApiOutputParameters.sampleFormat = sampleFormat;
        /* defaultHighOutputLatency is used below instead of
           defaultLowOutputLatency because it is more important for the default
           stream to work reliably than it is for it to work with the lowest
           latency.
         */
        hostApiOutputParameters.suggestedLatency =
             Pa_GetDeviceInfo( hostApiOutputParameters.device )->defaultHighOutputLatency;
        hostApiOutputParameters.hostApiSpecificStreamInfo = NULL;
        hostApiOutputParametersPtr = &hostApiOutputParameters;
    }
    else
    {
        hostApiOutputParametersPtr = NULL;
    }


    result = Pa_OpenStream(
                 stream, hostApiInputParametersPtr, hostApiOutputParametersPtr,
                 sampleRate, framesPerBuffer, paNoFlag, streamCallback, userData );

    PA_LOGAPI(("Pa_OpenDefaultStream returned:\n" ));
    PA_LOGAPI(("\t*(PaStream** stream): 0x%p", *stream ));
    PA_LOGAPI(("\tPaError: %d ( %s )\n", result, Pa_GetErrorText( result ) ));

    return result;
}